

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O2

void __thiscall mjs::call_expression::~call_expression(call_expression *this)

{
  (this->super_expression).super_syntax_node._vptr_syntax_node =
       (_func_int **)&PTR__call_expression_001c8498;
  std::
  vector<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>,_std::allocator<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>_>_>
  ::~vector(&this->arguments_);
  std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::~unique_ptr
            (&this->member_);
  syntax_node::~syntax_node((syntax_node *)this);
  return;
}

Assistant:

explicit call_expression(const source_extend& extend, expression_ptr&& member, expression_list&& arguments) : expression(extend), member_(std::move(member)), arguments_(std::move(arguments)) {
        assert(member_);
    }